

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  long *plVar1;
  Expr<float> *pEVar2;
  Interval *pIVar3;
  double dVar4;
  undefined7 uVar5;
  pointer pSVar6;
  IVal *pIVar7;
  ulong uVar8;
  long lVar9;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  _Stack_b8;
  int local_88;
  int iStack_84;
  int iStack_80;
  YesNoMaybe YStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  double local_68;
  Precision local_60;
  undefined1 *local_58;
  int local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_b8._M_impl.super__Rb_tree_header._M_header;
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  initialize(this);
  Environment::bind<float>
            ((Environment *)&_Stack_b8,
             (this->m_var0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,args->a
            );
  Environment::bind<float>
            ((Environment *)&_Stack_b8,
             (this->m_var1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,args->b
            );
  Environment::bind<float>
            ((Environment *)&_Stack_b8,
             (this->m_var2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,args->c
            );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_b8,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,args->d);
  local_60 = ctx->floatPrecision;
  local_50 = ctx->callDepth;
  local_68 = (ctx->format).m_maxValue;
  local_88 = (ctx->format).m_minExp;
  iStack_84 = (ctx->format).m_maxExp;
  iStack_80 = (ctx->format).m_fractionBits;
  YStack_7c = (ctx->format).m_hasSubnormal;
  local_78._0_4_ = (ctx->format).m_hasInf;
  local_78._4_4_ = (ctx->format).m_hasNaN;
  uStack_70 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  pSVar6 = (this->m_body).
           super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (undefined1 *)&_Stack_b8;
  if ((this->m_body).
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    lVar9 = 0;
    uVar8 = 0;
    local_58 = (undefined1 *)&_Stack_b8;
    do {
      plVar1 = *(long **)((long)&(pSVar6->
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>)
                                 .m_ptr + lVar9);
      (**(code **)(*plVar1 + 0x18))(plVar1,&local_88);
      uVar8 = uVar8 + 1;
      pSVar6 = (this->m_body).
               super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)(this->m_body).
                                   super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 4));
  }
  pEVar2 = (this->m_ret).super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(&local_48,pEVar2,&local_88);
  __return_storage_ptr__->m_hi = local_38;
  *(undefined8 *)__return_storage_ptr__ = local_48;
  __return_storage_ptr__->m_lo = dStack_40;
  pIVar7 = Environment::lookup<float>
                     ((Environment *)&_Stack_b8,
                      (this->m_var0).
                      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                      m_ptr);
  pIVar3 = args->a;
  pIVar3->m_hi = pIVar7->m_hi;
  uVar5 = *(undefined7 *)&pIVar7->field_0x1;
  dVar4 = pIVar7->m_lo;
  pIVar3->m_hasNaN = pIVar7->m_hasNaN;
  *(undefined7 *)&pIVar3->field_0x1 = uVar5;
  pIVar3->m_lo = dVar4;
  pIVar7 = Environment::lookup<float>
                     ((Environment *)&_Stack_b8,
                      (this->m_var1).
                      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                      m_ptr);
  pIVar3 = args->b;
  pIVar3->m_hi = pIVar7->m_hi;
  uVar5 = *(undefined7 *)&pIVar7->field_0x1;
  dVar4 = pIVar7->m_lo;
  pIVar3->m_hasNaN = pIVar7->m_hasNaN;
  *(undefined7 *)&pIVar3->field_0x1 = uVar5;
  pIVar3->m_lo = dVar4;
  pIVar7 = Environment::lookup<float>
                     ((Environment *)&_Stack_b8,
                      (this->m_var2).
                      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                      m_ptr);
  pIVar3 = args->c;
  pIVar3->m_hi = pIVar7->m_hi;
  uVar5 = *(undefined7 *)&pIVar7->field_0x1;
  dVar4 = pIVar7->m_lo;
  pIVar3->m_hasNaN = pIVar7->m_hasNaN;
  *(undefined7 *)&pIVar3->field_0x1 = uVar5;
  pIVar3->m_lo = dVar4;
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_b8,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&_Stack_b8);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}